

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O2

int gray_raster_render(PWorker worker,void *buffer,long buffer_size,PVG_FT_Raster_Params *params)

{
  int *piVar1;
  PVG_FT_Vector *pPVar2;
  long lVar3;
  long lVar4;
  PCell_conflict pTVar5;
  undefined1 auVar6 [16];
  PVG_FT_Pos PVar7;
  PVG_FT_Pos PVar8;
  PVG_FT_Pos PVar9;
  char *pcVar10;
  int *piVar11;
  char *pcVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  TCoord x;
  long lVar21;
  uint uVar22;
  long lVar23;
  PVG_FT_Vector *pPVar24;
  PVG_FT_Vector *pPVar25;
  PCell *ppTVar26;
  TBand *band;
  int num_bands;
  int n;
  TPos max;
  TPos min;
  TBand bands [40];
  
  piVar1 = (int *)params->source;
  iVar15 = -1;
  iVar16 = iVar15;
  if (piVar1 != (int *)0x0) {
    iVar16 = 0;
    if ((((piVar1[1] != 0) && (0 < (long)*piVar1)) && (iVar16 = iVar15, *(long *)(piVar1 + 6) != 0))
       && ((*(long *)(piVar1 + 2) != 0 &&
           (piVar1[1] == *(int *)(*(long *)(piVar1 + 6) + -4 + (long)*piVar1 * 4) + 1)))) {
      if ((~params->flags & 3U) == 0) {
        if ((params->flags & 4U) == 0) {
          (worker->clip_box).xMin = -0x800000;
          (worker->clip_box).yMin = -0x800000;
          (worker->clip_box).xMax = 0x7fffff;
          (worker->clip_box).yMax = 0x7fffff;
        }
        else {
          PVar7 = (params->clip_box).xMin;
          PVar8 = (params->clip_box).yMin;
          PVar9 = (params->clip_box).yMax;
          (worker->clip_box).xMax = (params->clip_box).xMax;
          (worker->clip_box).yMax = PVar9;
          (worker->clip_box).xMin = PVar7;
          (worker->clip_box).yMin = PVar8;
        }
        worker->buffer = buffer;
        worker->buffer_size = buffer_size;
        worker->ycells = (PCell_conflict *)buffer;
        worker->area = 0;
        worker->cover = 0;
        worker->invalid = 1;
        worker->num_cells = 0;
        worker->cells = (PCell_conflict)0x0;
        worker->max_cells = 0;
        iVar16 = piVar1[1];
        pPVar2 = *(PVG_FT_Vector **)(piVar1 + 2);
        pcVar10 = *(char **)(piVar1 + 4);
        piVar11 = *(int **)(piVar1 + 6);
        pcVar12 = *(char **)(piVar1 + 8);
        iVar15 = piVar1[10];
        iVar14 = piVar1[0xb];
        (worker->outline).n_contours = piVar1[0];
        (worker->outline).n_points = iVar16;
        (worker->outline).points = pPVar2;
        (worker->outline).tags = pcVar10;
        (worker->outline).contours = piVar11;
        (worker->outline).contours_flag = pcVar12;
        (worker->outline).flags = iVar15;
        *(int *)&(worker->outline).field_0x2c = iVar14;
        worker->invalid = 1;
        iVar15 = (int)(buffer_size / 0xc0);
        worker->band_size = iVar15;
        pvVar13 = params->user;
        worker->render_span = params->gray_spans;
        worker->render_span_data = pvVar13;
        worker->num_gray_spans = 0;
        lVar23 = (long)(worker->outline).n_points;
        if (lVar23 < 1) {
          worker->min_ey = 0;
          worker->max_ey = 0;
          worker->min_ex = 0;
          worker->max_ex = 0;
          min = 0;
          lVar21 = 0;
          lVar19 = 0;
          lVar23 = 0;
        }
        else {
          pPVar2 = (worker->outline).points;
          lVar21 = pPVar2->x;
          lVar17 = pPVar2->y;
          lVar19 = lVar21;
          pPVar25 = pPVar2;
          lVar18 = lVar17;
          while (pPVar24 = pPVar25 + 1, pPVar24 < pPVar2 + lVar23) {
            lVar3 = pPVar24->x;
            lVar4 = pPVar25[1].y;
            if (lVar3 < lVar19) {
              worker->min_ex = lVar3;
              lVar19 = lVar3;
            }
            if (lVar21 < lVar3) {
              worker->max_ex = lVar3;
              lVar21 = lVar3;
            }
            if (lVar4 < lVar17) {
              worker->min_ey = lVar4;
              lVar17 = lVar4;
            }
            pPVar25 = pPVar24;
            if (lVar18 < lVar4) {
              worker->max_ey = lVar4;
              lVar18 = lVar4;
            }
          }
          lVar19 = lVar19 >> 6;
          worker->min_ex = lVar19;
          min = lVar17 >> 6;
          worker->min_ey = min;
          lVar23 = lVar21 + 0x3f >> 6;
          worker->max_ex = lVar23;
          lVar21 = lVar18 + 0x3f >> 6;
          worker->max_ey = lVar21;
        }
        lVar17 = (worker->clip_box).xMin;
        iVar16 = 0;
        if (((lVar17 < lVar23) && (lVar18 = (worker->clip_box).xMax, lVar19 < lVar18)) &&
           ((lVar3 = (worker->clip_box).yMin, lVar3 < lVar21 &&
            (lVar4 = (worker->clip_box).yMax, min < lVar4)))) {
          if (lVar19 < lVar17) {
            worker->min_ex = lVar17;
            lVar19 = lVar17;
          }
          if (min < lVar3) {
            worker->min_ey = lVar3;
            min = lVar3;
          }
          if (lVar18 < lVar23) {
            worker->max_ex = lVar18;
            lVar23 = lVar18;
          }
          if (lVar4 < lVar21) {
            worker->max_ey = lVar4;
            lVar21 = lVar4;
          }
          worker->count_ex = lVar23 - lVar19;
          worker->count_ey = lVar21 - min;
          num_bands = (int)((lVar21 - min) / (long)iVar15);
          if (num_bands == 0) {
            num_bands = 1;
          }
          if (0x26 < num_bands) {
            num_bands = 0x27;
          }
          worker->band_shoot = 0;
          n = 0;
LAB_001165b4:
          if (n < num_bands) {
            max = worker->band_size + min;
            if ((n == num_bands + -1) || (lVar21 < max)) {
              max = lVar21;
            }
            bands[0].min = min;
            bands[0].max = max;
            band = bands;
LAB_00116618:
            do {
              if (band < bands) goto LAB_00116864;
              worker->ycells = (PCell_conflict *)worker->buffer;
              lVar23 = band->max - band->min;
              worker->ycount = lVar23;
              iVar15 = (int)lVar23 * 8;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = (long)iVar15;
              iVar16 = (iVar15 - SUB164(auVar6 % ZEXT816(0x18),0)) + 0x18;
              if (SUB168(auVar6 % ZEXT816(0x18),0) == 0) {
                iVar16 = iVar15;
              }
              iVar15 = (int)worker->buffer_size;
              lVar19 = (long)(iVar15 - (int)((ulong)(long)iVar15 % 0x18));
              lVar17 = (long)iVar16;
              worker->cells = (PCell_conflict)((long)worker->buffer + lVar17);
              lVar18 = lVar19 - lVar17;
              if ((lVar18 != 0 && lVar17 <= lVar19) &&
                 (worker->max_cells = lVar18 / 0x18, 0x2f < lVar18)) {
                if (lVar23 < 1) {
                  lVar23 = 0;
                }
                for (lVar17 = 0; lVar23 != lVar17; lVar17 = lVar17 + 1) {
                  worker->ycells[lVar17] = (PCell_conflict)0x0;
                }
                worker->num_cells = 0;
                worker->invalid = 1;
                worker->min_ey = band->min;
                worker->max_ey = band->max;
                worker->count_ey = band->max - band->min;
                iVar16 = gray_convert_glyph_inner(worker);
                if (iVar16 != -4) {
                  if (iVar16 != 0) {
                    return 1;
                  }
                  if (worker->num_cells != 0) {
                    for (lVar23 = 0; lVar23 < worker->ycount; lVar23 = lVar23 + 1) {
                      ppTVar26 = worker->ycells + lVar23;
                      lVar17 = 0;
                      x = 0;
                      while( true ) {
                        pTVar5 = *ppTVar26;
                        if (pTVar5 == (PCell_conflict)0x0) break;
                        uVar22 = pTVar5->x;
                        if ((lVar17 != 0) && (x < (int)uVar22)) {
                          gray_hline(worker,x,lVar23,lVar17 << 9,uVar22 - (int)x);
                          uVar22 = pTVar5->x;
                        }
                        lVar17 = lVar17 + pTVar5->cover;
                        lVar19 = lVar17 * 0x200 - pTVar5->area;
                        if ((lVar19 != 0) && (-1 < (int)uVar22)) {
                          gray_hline(worker,(ulong)uVar22,lVar23,lVar19,1);
                          uVar22 = pTVar5->x;
                        }
                        x = (TCoord)(int)(uVar22 + 1);
                        ppTVar26 = &pTVar5->next;
                      }
                      if ((lVar17 != 0) && (x < worker->count_ex)) {
                        gray_hline(worker,x,lVar23,lVar17 << 9,(int)worker->count_ex - (int)x);
                      }
                    }
                  }
                  band = band + -1;
                  goto LAB_00116618;
                }
              }
              lVar23 = band->min;
              lVar17 = band->max;
              if ((ulong)(lVar17 - lVar23) < 2) {
                return -6;
              }
              if ((long)worker->band_size <= lVar23 - lVar17) {
                worker->band_shoot = worker->band_shoot + 1;
              }
              lVar19 = (lVar17 - lVar23 >> 1) + lVar23;
              band[1].min = lVar23;
              band[1].max = lVar19;
              band->min = lVar19;
              band->max = lVar17;
              band = band + 1;
            } while( true );
          }
          iVar16 = worker->num_gray_spans;
          if ((worker->render_span != (PVG_FT_SpanFunc)0x0) &&
             (uVar22 = worker->skip_spans, (int)uVar22 < iVar16)) {
            uVar20 = 0;
            if (0 < (int)uVar22) {
              uVar20 = (ulong)uVar22;
            }
            (*worker->render_span)
                      (iVar16 - (int)uVar20,worker->gray_spans + uVar20,worker->render_span_data);
            iVar16 = worker->num_gray_spans;
          }
          worker->skip_spans = worker->skip_spans - iVar16;
          iVar16 = 0;
          if ((8 < worker->band_shoot) && (0x10 < worker->band_size)) {
            worker->band_size = (uint)worker->band_size >> 1;
          }
        }
      }
      else {
        iVar16 = -2;
      }
    }
  }
  return iVar16;
LAB_00116864:
  n = n + 1;
  min = max;
  goto LAB_001165b4;
}

Assistant:

static int
  gray_raster_render( RAS_ARG_ void* buffer, long buffer_size,
                      const PVG_FT_Raster_Params*  params )
  {
    const PVG_FT_Outline*  outline    = (const PVG_FT_Outline*)params->source;
    if ( outline == NULL )
      return ErrRaster_Invalid_Outline;

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return ErrRaster_Invalid_Outline;

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return ErrRaster_Invalid_Outline;

    /* this version does not support monochrome rendering */
    if ( !( params->flags & PVG_FT_RASTER_FLAG_AA ) )
      return ErrRaster_Invalid_Mode;

    if ( !( params->flags & PVG_FT_RASTER_FLAG_DIRECT ) )
      return ErrRaster_Invalid_Mode;

    /* compute clipping box */
    if ( params->flags & PVG_FT_RASTER_FLAG_CLIP )
    {
      ras.clip_box = params->clip_box;
    }
    else
    {
      ras.clip_box.xMin = -(1 << 23);
      ras.clip_box.yMin = -(1 << 23);
      ras.clip_box.xMax =  (1 << 23) - 1;
      ras.clip_box.yMax =  (1 << 23) - 1;
    }

    gray_init_cells( RAS_VAR_ buffer, buffer_size );

    ras.outline   = *outline;
    ras.num_cells = 0;
    ras.invalid   = 1;
    ras.band_size = (int)(buffer_size / (long)(sizeof(TCell) * 8));

    ras.render_span      = (PVG_FT_Raster_Span_Func)params->gray_spans;
    ras.render_span_data = params->user;

    return gray_convert_glyph( RAS_VAR );
  }